

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_float64_suite::test_array8_float64_two(void)

{
  value_type expected [16];
  value_type input [18];
  decoder decoder;
  value local_9c;
  value local_98 [4];
  undefined1 local_88 [12];
  undefined4 local_7c;
  uchar local_78 [32];
  decoder local_58;
  
  local_78[0] = 0xaf;
  local_78[1] = '\x10';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = 0xf0;
  local_78[9] = '?';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  local_78[0x10] = 0xf0;
  local_78[0x11] = '?';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[18]>
            (&local_58,(uchar (*) [18])local_78);
  local_98[0] = local_58.current.code;
  local_9c = 0xaf;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array8_float64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xf01,"void compact_float64_suite::test_array8_float64_two()",local_98,&local_9c);
  local_98[0] = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  local_9c = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xf02,"void compact_float64_suite::test_array8_float64_two()",local_98,&local_9c);
  local_98[0] = trial::protocol::bintoken::detail::decoder::category(&local_58);
  local_9c = data;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xf03,"void compact_float64_suite::test_array8_float64_two()",local_98,&local_9c);
  local_98[0] = status;
  local_98[1] = 0x3ff00000;
  local_98[2] = 0;
  local_98[3] = 0x3ff00000;
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xf0a,"void compact_float64_suite::test_array8_float64_two()",
             local_58.current.view._M_str,
             local_58.current.view._M_str + local_58.current.view._M_len,local_98,local_88);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_9c = local_58.current.code;
  local_7c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xf0c,"void compact_float64_suite::test_array8_float64_two()",&local_9c,&local_7c);
  return;
}

Assistant:

void test_array8_float64_two()
{
    const value_type input[] = { token::code::array8_float64, 0x10, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array8_float64);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}